

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

duration __thiscall
timertt::details::
manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
::timeout_before_nearest_timer<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> default_timeout)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<bool,_time_point<steady_clock,_duration<long,_ratio<1L,_1000000000L>_>_>_>_>
  *p_Var2;
  type tVar3;
  int local_44;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_40;
  __tuple_element_t<1UL,_tuple<bool,_time_point<steady_clock,_duration<long,_ratio<1L,_1000000000L>_>_>_>_>
  *f;
  time_point now;
  tuple<bool,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  r;
  manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> default_timeout_local;
  
  manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  ::nearest_time_point
            ((manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
              *)&now);
  p_Var2 = std::
           get<0ul,bool,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                     ((tuple<bool,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                       *)&now);
  tVar3.__r = default_timeout.__r;
  if ((*p_Var2 & 1U) != 0) {
    f = (__tuple_element_t<1UL,_tuple<bool,_time_point<steady_clock,_duration<long,_ratio<1L,_1000000000L>_>_>_>_>
         *)std::chrono::_V2::steady_clock::now();
    local_40 = std::
               get<1ul,bool,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                         ((tuple<bool,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                           *)&now);
    bVar1 = std::chrono::operator>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&f,local_40);
    if (bVar1) {
      local_44 = 0;
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&default_timeout_local,&local_44);
      tVar3.__r = default_timeout_local.__r;
    }
    else {
      tVar3 = std::chrono::operator-
                        (local_40,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&f);
    }
  }
  default_timeout_local.__r = tVar3.__r;
  return (duration)default_timeout_local.__r;
}

Assistant:

monotonic_clock::duration
	timeout_before_nearest_timer(
		//! Default timeout value which will be used if there is no any timers.
		DURATION default_timeout )
	{
		auto r = this->nearest_time_point();
		if( std::get<0>( r ) )
		{
			auto now = monotonic_clock::now();
			const auto & f = std::get<1>( r );
			if( now > f )
				return monotonic_clock::duration( 0 );
			else
				return (f - now);
		}
		else
			return default_timeout;
	}